

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void sysbvm_jit_x86_movS32IntoMemoryWithOffset
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,int32_t offset,
               int32_t immediate)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar4;
  undefined1 uVar5;
  size_t byteCount;
  uint8_t instruction [12];
  uint local_c;
  undefined1 local_8;
  undefined1 local_7;
  undefined1 local_6;
  undefined1 local_5;
  undefined1 local_4;
  undefined1 local_3;
  undefined1 local_2;
  undefined1 local_1;
  undefined1 uVar3;
  
  uVar5 = (undefined1)destination;
  uVar2 = (undefined1)immediate;
  uVar4 = (undefined1)((uint)immediate >> 8);
  uVar3 = (undefined1)((uint)immediate >> 0x18);
  uVar1 = (undefined1)((uint)immediate >> 0x10);
  if ((destination & SYSBVM_X86_64_ARG0) == SYSBVM_X86_EBP || offset != 0) {
    local_7 = (undefined1)((uint)offset >> 8);
    local_5 = (undefined1)((uint)offset >> 0x18);
    local_6 = (undefined1)((uint)offset >> 0x10);
    if ((destination & SYSBVM_X86_64_ARG0) == SYSBVM_X86_ESP) {
      local_c = 0x2484c748;
      byteCount = 0xc;
      local_8 = (char)offset;
      local_4 = uVar2;
      local_3 = uVar4;
      local_2 = uVar1;
      local_1 = uVar3;
    }
    else {
      local_c = CONCAT13((char)offset,CONCAT12(uVar5,0xc748)) & 0xff07ffff | 0x800000;
      byteCount = 0xb;
      local_8 = local_7;
      local_7 = local_6;
      local_6 = local_5;
      local_5 = uVar2;
      local_4 = uVar4;
      local_3 = uVar1;
      local_2 = uVar3;
    }
  }
  else {
    local_c = CONCAT13(uVar5,CONCAT12(uVar5,0xc748)) & 0x707ffff | 0x20000000;
    byteCount = 8;
    local_8 = uVar2;
    local_7 = uVar4;
    local_6 = uVar1;
    local_5 = uVar3;
  }
  sysbvm_bytecodeJit_addBytes(jit,byteCount,(uint8_t *)&local_c);
  return;
}

Assistant:

static void sysbvm_jit_x86_movS32IntoMemoryWithOffset(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, int32_t offset, int32_t immediate)
{
    if(offset == 0 && (destination & SYSBVM_X86_REG_HALF_MASK) != SYSBVM_X86_RBP)
    {
        if((destination & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0xC7,
                sysbvm_jit_x86_modRM(destination, 0, 0),
                sysbvm_jit_x86_sibOnlyBase(destination),
                immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0xC7,
                sysbvm_jit_x86_modRM(destination, 0, 0),
                immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
    else
    {
        if((destination & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0xC7,
                sysbvm_jit_x86_modRM(destination, 0, 2),
                sysbvm_jit_x86_sibOnlyBase(destination),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
                immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0xC7,
                sysbvm_jit_x86_modRM(destination, 0, 2),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
                immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
}